

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFArray.cpp
# Opt level: O2

void __thiscall PDFArray::~PDFArray(PDFArray *this)

{
  pointer ppPVar1;
  
  (this->super_PDFObject).super_RefCountObject._vptr_RefCountObject =
       (_func_int **)&PTR__PDFArray_0036ff78;
  for (ppPVar1 = (this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppPVar1 !=
      (this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
    RefCountObject::Release(&(*ppPVar1)->super_RefCountObject);
  }
  std::_Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>::~_Vector_base
            (&(this->mValues).super__Vector_base<PDFObject_*,_std::allocator<PDFObject_*>_>);
  PDFObject::~PDFObject(&this->super_PDFObject);
  return;
}

Assistant:

PDFArray::~PDFArray(void)
{
	PDFObjectVector::iterator it = mValues.begin();

	for(; it != mValues.end(); ++it)
		(*it)->Release();
}